

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O1

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  int _c;
  int iVar11;
  long lVar12;
  ulong uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  int iVar18;
  undefined4 *puVar19;
  ulong local_90;
  ulong local_80;
  undefined4 *local_78;
  undefined4 *local_68;
  
  iVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar11 = this->upscale_factor;
  uVar10 = (long)bottom_blob->c / (long)(iVar11 * iVar11);
  _c = (int)uVar10;
  Mat::create(top_blob,iVar11 * iVar1,uVar2 * iVar11,_c,bottom_blob->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < _c) {
      local_68 = (undefined4 *)top_blob->data;
      sVar5 = top_blob->elemsize;
      uVar3 = this->upscale_factor;
      lVar12 = (long)top_blob->w * sVar5;
      sVar6 = top_blob->cstep;
      local_90 = 0;
      do {
        if (0 < (int)uVar3) {
          iVar11 = this->mode;
          local_78 = local_68;
          local_80 = 0;
          do {
            if (0 < (int)uVar3) {
              pvVar7 = bottom_blob->data;
              sVar8 = bottom_blob->cstep;
              sVar9 = bottom_blob->elemsize;
              iVar4 = this->upscale_factor;
              uVar13 = 0;
              puVar16 = local_78;
              do {
                if (0 < (int)uVar2) {
                  iVar18 = (uVar3 * (int)local_80 + (int)uVar13) * _c + (int)local_90;
                  if (iVar11 == 0) {
                    iVar18 = (uVar3 * (int)local_90 + (int)local_80) * uVar3 + (int)uVar13;
                  }
                  puVar19 = (undefined4 *)((long)iVar18 * sVar8 * sVar9 + (long)pvVar7);
                  uVar15 = 0;
                  puVar14 = puVar16;
                  do {
                    puVar17 = puVar14;
                    iVar18 = iVar1;
                    if (0 < iVar1) {
                      do {
                        *puVar17 = *puVar19;
                        puVar19 = puVar19 + 1;
                        puVar17 = puVar17 + iVar4;
                        iVar18 = iVar18 + -1;
                      } while (iVar18 != 0);
                    }
                    uVar15 = uVar15 + 1;
                    puVar14 = (undefined4 *)((long)puVar14 + lVar12 * iVar4);
                  } while (uVar15 != uVar2);
                }
                uVar13 = uVar13 + 1;
                puVar16 = puVar16 + 1;
              } while (uVar13 != uVar3);
            }
            local_80 = local_80 + 1;
            local_78 = (undefined4 *)((long)local_78 + lVar12);
          } while (local_80 != uVar3);
        }
        local_90 = local_90 + 1;
        local_68 = (undefined4 *)((long)local_68 + sVar5 * sVar6);
      } while (local_90 != (uVar10 & 0xffffffff));
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                int q;
                if (mode == 0)
                    q = p * upscale_factor * upscale_factor + sh * upscale_factor + sw;
                else // if (mode == 1)
                    q = (sh * upscale_factor + sw) * outc + p;

                const float* sptr = bottom_blob.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i * upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}